

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O3

void get_yolo_detections(yolo_layer *layer,vector<detection,_std::allocator<detection>_> *detections
                        ,int im_w,int im_h,int netw,int neth,float thresh)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  pointer pfVar3;
  pointer pfVar4;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  float fVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float in_XMM5_Db;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vector<detection,_std::allocator<detection>_> result;
  value_type local_148;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  pointer local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  double local_a8;
  double dStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [24];
  
  uVar2 = layer->w;
  uVar5 = layer->h;
  pfVar3 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (pointer)0x0;
  iVar11 = uVar5 * uVar2;
  if (0 < iVar11) {
    local_88 = CONCAT44((float)(int)uVar5,(float)(int)uVar2);
    uStack_80 = 0;
    local_d8 = ZEXT416((uint)netw);
    local_e8 = ZEXT416((uint)neth);
    local_98 = CONCAT44(neth,netw);
    local_a8 = (double)netw;
    dStack_a0 = (double)neth;
    uStack_90 = 0;
    local_118._0_8_ = CONCAT44((float)neth,(float)netw);
    local_118._8_8_ = 0;
    auVar23._0_4_ = (float)im_w;
    auVar23._4_4_ = (float)im_h;
    auVar23._8_8_ = 0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_118._0_8_;
    local_b8 = divps(auVar28,auVar23);
    local_c8 = local_b8._4_4_;
    uVar17 = (uint)((ulong)((long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 2);
    iVar10 = 0;
    fStack_c4 = local_c8;
    fStack_c0 = local_c8;
    fStack_bc = local_c8;
    do {
      if (0 < (int)uVar17) {
        uVar13 = 0;
        do {
          iVar14 = iVar11 * (int)uVar13 + iVar10;
          iVar16 = layer->h * layer->w;
          iVar15 = (layer->classes + 5) * (iVar14 / iVar16);
          fVar1 = pfVar3[(iVar15 + 4) * iVar16 + iVar14 % iVar16];
          if (thresh < fVar1) {
            local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar16 = iVar15 * iVar16 + iVar14 % iVar16;
            pfVar4 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = (layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            local_48._0_16_ = ZEXT416((uint)pfVar4[iVar16]);
            local_68 = ZEXT416((uint)pfVar4[iVar11 + iVar16]);
            local_58 = exp((double)pfVar4[iVar11 * 2 + iVar16]);
            local_78 = ZEXT416((uint)(layer->anchors).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[(long)iVar15 * 2]);
            dVar19 = exp((double)pfVar4[iVar11 * 3 + iVar16]);
            auVar6._8_4_ = fStack_bc;
            auVar6._4_4_ = fStack_c0;
            if (local_c8 <= (float)local_b8._0_4_) {
              iVar16 = (neth * im_w) / im_h;
              auVar6._0_4_ = local_118._4_4_;
              auVar26._0_8_ = auVar6._0_8_ << 0x20;
              auVar26._8_4_ = local_118._8_4_;
              auVar26._12_4_ = local_118._12_4_;
              auVar20._4_12_ = auVar26._4_12_;
              auVar20._0_4_ = (float)iVar16;
              iVar9 = local_e8._0_4_;
            }
            else {
              iVar9 = (netw * im_h) / im_w;
              auVar20._4_4_ = (float)iVar9;
              auVar20._0_4_ = (float)local_118._0_4_;
              auVar20._8_4_ = local_118._8_4_;
              auVar20._12_4_ = local_118._12_4_;
              iVar16 = local_d8._0_4_;
            }
            auVar27._0_4_ = (float)local_48._0_4_ + (float)(iVar10 % (int)uVar2);
            auVar27._4_4_ = (float)local_68._0_4_ + (float)(iVar10 / (int)uVar2);
            auVar27._8_4_ = (float)local_48._4_4_ + 0.0;
            auVar27._12_4_ = (float)local_68._4_4_ + in_XMM5_Db;
            auVar8._8_8_ = uStack_80;
            auVar8._0_8_ = local_88;
            auVar28 = divps(auVar27,auVar8);
            auVar25._0_8_ = local_58 * (double)(float)local_78._0_4_;
            auVar25._8_8_ =
                 dVar19 * (double)(layer->anchors).super__Vector_base<float,_std::allocator<float>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar15 * 2 + 1];
            auVar7._8_8_ = dStack_a0;
            auVar7._0_8_ = local_a8;
            in_XMM5_Db = (float)((ulong)local_a8 >> 0x20);
            auVar26 = divpd(auVar25,auVar7);
            auVar22._0_8_ = (double)((int)local_98 - iVar16) * -0.5;
            auVar22._8_8_ = (double)(local_98._4_4_ - iVar9) * -0.5;
            auVar23 = divpd(auVar22,auVar7);
            auVar24._0_8_ = auVar23._0_8_ + (double)auVar28._0_4_;
            auVar24._8_8_ = auVar23._8_8_ + (double)auVar28._4_4_;
            auVar28 = divps(local_118,auVar20);
            auVar23 = divps(auVar20,local_118);
            auVar21._0_8_ = (double)auVar23._0_4_;
            auVar21._8_8_ = (double)auVar23._4_4_;
            auVar23 = divpd(auVar24,auVar21);
            local_148.bbox.x = (float)auVar23._0_8_;
            local_148.bbox.y = (float)auVar23._8_8_;
            local_148.bbox.w = auVar28._0_4_ * (float)auVar26._0_8_;
            local_148.bbox.h = auVar28._4_4_ * (float)auVar26._8_8_;
            local_148.objectness = fVar1;
            std::vector<float,_std::allocator<float>_>::resize(&local_148.prob,(long)layer->classes)
            ;
            iVar15 = layer->classes;
            if (0 < (long)iVar15) {
              iVar16 = layer->h * layer->w;
              iVar14 = ((iVar15 + 5) * (iVar14 / iVar16) + 5) * iVar16 + iVar14 % iVar16;
              lVar12 = 0;
              do {
                fVar18 = pfVar3[iVar14] * fVar1;
                local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12] =
                     (float)(-(uint)(thresh < fVar18) & (uint)fVar18);
                lVar12 = lVar12 + 1;
                iVar14 = iVar14 + iVar16;
              } while (iVar15 != lVar12);
            }
            std::vector<detection,_std::allocator<detection>_>::push_back(detections,&local_148);
            if (local_148.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148.prob.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_148.prob.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.prob.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uVar17 & 0x7fffffff));
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar11);
  }
  std::vector<detection,_std::allocator<detection>_>::~vector
            ((vector<detection,_std::allocator<detection>_> *)local_108);
  return;
}

Assistant:

static void get_yolo_detections(const yolo_layer & layer, std::vector<detection> & detections, int im_w, int im_h, int netw, int neth, float thresh)
{
    int w = layer.w;
    int h = layer.h;
    int N = layer.mask.size();
    const float * predictions = layer.predictions.data();
    std::vector<detection> result;
    for (int i = 0; i < w*h; i++) {
        for (int n = 0; n < N; n++) {
            int obj_index = layer.entry_index(n*w*h + i, 4);
            float objectness = predictions[obj_index];
            if (objectness <= thresh) {
                continue;
            }
            detection det;
            int box_index = layer.entry_index(n*w*h + i, 0);
            int row = i / w;
            int col = i % w;
            det.bbox = get_yolo_box(layer, layer.mask[n], box_index, col, row, w, h, netw, neth, w*h);
            correct_yolo_box(det.bbox, im_w, im_h, netw, neth);
            det.objectness = objectness;
            det.prob.resize(layer.classes);
            for (int j = 0; j < layer.classes; j++) {
                int class_index = layer.entry_index(n*w*h + i, 4 + 1 + j);
                float prob = objectness*predictions[class_index];
                det.prob[j] = (prob > thresh) ? prob : 0;
            }
            detections.push_back(det);
        }
    }
}